

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_acc_or_set(ggml_context *ctx,ggml_cgraph *cgraph,size_t isrc,ggml_tensor *tensor,
                    size_t nb1,size_t nb2,size_t nb3,size_t offset)

{
  ggml_tensor *pgVar1;
  size_t in_RCX;
  size_t in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  size_t in_R8;
  undefined8 in_R9;
  _Bool inplace;
  ggml_context *unaff_retaddr;
  ggml_tensor *in_stack_00000010;
  ggml_tensor *a_zero;
  ggml_tensor *src;
  ggml_tensor *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  
  inplace = SUB81((ulong)in_R9 >> 0x38,0);
  if (*(long *)(in_RSI->nb[2] + in_RDX * 8) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1487,"GGML_ASSERT(%s) failed","src");
  }
  if (*(long *)(in_RSI->ne[1] + in_RDX * 8) == 0) {
    ggml_scale((ggml_context *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,0.0);
    uVar2 = 0;
    pgVar1 = ggml_acc_impl(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_stack_00000010
                           ,inplace);
    *(ggml_tensor **)(in_RSI->ne[1] + in_RDX * 8) = pgVar1;
  }
  else {
    uVar2 = (uint)(*(long *)(in_RSI->ne[2] + in_RDX * 8) != 0);
    pgVar1 = ggml_acc_impl(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_stack_00000010
                           ,inplace);
    *(ggml_tensor **)(in_RSI->ne[1] + in_RDX * 8) = pgVar1;
  }
  ggml_format_name(*(ggml_tensor **)(in_RSI->ne[1] + in_RDX * 8),"grad for %s",
                   *(long *)(in_RSI->nb[2] + in_RDX * 8) + 0x100);
  ggml_build_forward_expand
            ((ggml_cgraph *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),in_stack_00000010);
  return;
}

Assistant:

static void ggml_acc_or_set(
        struct ggml_context * ctx,
        struct ggml_cgraph  * cgraph,
        size_t                isrc,
        struct ggml_tensor  * tensor,
        const  size_t         nb1,
        const  size_t         nb2,
        const  size_t         nb3,
        const  size_t         offset) {
    struct ggml_tensor * src = cgraph->visited_hash_set.keys[isrc];
    GGML_ASSERT(src);
    if (cgraph->grads[isrc]) {
        cgraph->grads[isrc] = ggml_acc_impl(ctx, cgraph->grads[isrc], tensor, nb1, nb2, nb3, offset, cgraph->grad_accs[isrc]);
    } else {
        struct ggml_tensor * a_zero = ggml_scale(ctx, src, 0.0f); // FIXME this is going to produce NaN if a contains inf/NaN
        cgraph->grads[isrc] = ggml_acc_impl(ctx, a_zero, tensor, nb1, nb2, nb3, offset, false);
    }
    ggml_format_name(cgraph->grads[isrc], "grad for %s", cgraph->visited_hash_set.keys[isrc]->name);
    ggml_build_forward_expand(cgraph, cgraph->grads[isrc]);
}